

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
* __thiscall
Catch::
ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
::operator<(BinaryExpr<const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&,_const_type_safe::basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type>_&>
            *__return_storage_ptr__,
           ExprLhs<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
           *this,basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *rhs)

{
  basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> *pbVar1;
  undefined1 uVar2;
  less_visitor v;
  undefined1 local_41;
  StringRef local_40;
  
  pbVar1 = *(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **)this;
  if ((pbVar1->storage_).storage_.cur_type_.
      super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
      .value_ == 0) {
    uVar2 = (rhs->storage_).storage_.cur_type_.
            super_strong_typedef<type_safe::tagged_union<int,_double,_debugger_type>::type_id,_unsigned_long>
            .value_ != 0;
  }
  else {
    local_41 = 0;
    type_safe::detail::
    with_union<type_safe::detail::compare_variant<type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>>::less_visitor&,type_safe::tagged_union<int,double,debugger_type>const&,type_safe::union_types<int,double,debugger_type>,type_safe::basic_variant<type_safe::optional_variant_policy,int,double,debugger_type>const&>
    ::with_impl<int,double,debugger_type>(pbVar1,&local_41,rhs);
    pbVar1 = *(basic_variant<type_safe::optional_variant_policy,_int,_double,_debugger_type> **)this
    ;
    uVar2 = local_41;
  }
  StringRef::StringRef(&local_40,"<");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = (bool)uVar2;
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_00230b70;
  __return_storage_ptr__->m_lhs = pbVar1;
  (__return_storage_ptr__->m_op).m_start = local_40.m_start;
  (__return_storage_ptr__->m_op).m_size = local_40.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator < ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { static_cast<bool>(m_lhs < rhs), m_lhs, "<", rhs };
        }